

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.hh
# Opt level: O2

void __thiscall kratos::EventTracingStmt::~EventTracingStmt(EventTracingStmt *this)

{
  ~EventTracingStmt(this);
  operator_delete(this,0x170);
  return;
}

Assistant:

void add_event_field(const std::string &name, const std::shared_ptr<Var> &var) {
        event_fields_.emplace(name, var);
    }